

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

Request * __thiscall
ROM::Request::append(Request *__return_storage_ptr__,Request *this,Type type,Request *rhs)

{
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *this_00;
  Type TVar1;
  Type TVar2;
  Node *pNVar3;
  bool bVar4;
  
  TVar1 = (this->node).type;
  TVar2 = (rhs->node).type;
  if ((TVar1 == One) && ((this->node).name == None)) {
    pNVar3 = &rhs->node;
    if ((TVar2 != One) || (bVar4 = true, (rhs->node).name != None)) goto LAB_0036d28f;
  }
  else {
    bVar4 = (rhs->node).name == None;
  }
  if ((TVar2 != One) || (pNVar3 = &this->node, !bVar4)) {
    if ((TVar1 ^ type) == Any && (TVar2 ^ type) == Any) {
      Node::Node(&__return_storage_ptr__->node,&this->node);
      std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>::
      insert<__gnu_cxx::__normal_iterator<ROM::Request::Node_const*,std::vector<ROM::Request::Node,std::allocator<ROM::Request::Node>>>,void>
                ((vector<ROM::Request::Node,std::allocator<ROM::Request::Node>> *)
                 &(__return_storage_ptr__->node).children,
                 (__return_storage_ptr__->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 (rhs->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (rhs->node).children.
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    if ((TVar1 ^ type) == Any && TVar2 == One) {
      Node::Node(&__return_storage_ptr__->node,&this->node);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,&rhs->node);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    if (TVar1 == One && (TVar2 ^ type) == Any) {
      Node::Node(&__return_storage_ptr__->node,&rhs->node);
      std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
                (&(__return_storage_ptr__->node).children,&this->node);
      Node::sort(&__return_storage_ptr__->node);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->node).name = None;
    (__return_storage_ptr__->node).is_optional = false;
    this_00 = &(__return_storage_ptr__->node).children;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->node).children.
    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->node).type = type;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
              (this_00,&this->node);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::push_back
              (this_00,&rhs->node);
    return __return_storage_ptr__;
  }
LAB_0036d28f:
  Node::Node(&__return_storage_ptr__->node,pNVar3);
  return __return_storage_ptr__;
}

Assistant:

Request Request::append(Node::Type type, const Request &rhs) {
	// If either side is empty, act appropriately.
	if(node.empty() && !rhs.node.empty()) {
		return rhs;
	}
	if(rhs.node.empty()) {
		return *this;
	}

	// Just copy in the RHS child nodes if types match.
	if(node.type == type && rhs.node.type == type) {
		Request new_request = *this;
		new_request.node.children.insert(new_request.node.children.end(), rhs.node.children.begin(), rhs.node.children.end());
		new_request.node.sort();
		return new_request;
	}

	// Possibly: left is appropriate request and rhs is just one more thing?
	if(node.type == type && rhs.node.type == Node::Type::One) {
		Request new_request = *this;
		new_request.node.children.push_back(rhs.node);
		new_request.node.sort();
		return new_request;
	}

	// Or: right is appropriate request and this is just one more thing?
	if(rhs.node.type == type && node.type == Node::Type::One) {
		Request new_request = rhs;
		new_request.node.children.push_back(node);
		new_request.node.sort();
		return new_request;
	}

	// Otherwise create a new parent node.
	Request parent;
	parent.node.type = type;
	parent.node.children.push_back(this->node);
	parent.node.children.push_back(rhs.node);
	return parent;
}